

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuslistener.cpp
# Opt level: O0

void __thiscall QDBusListener::populateSignalMap(QDBusListener *this)

{
  bool bVar1;
  DBusKey *this_00;
  DBusKey *key;
  DBusKey *this_01;
  long in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QString *saveJsonFile;
  QString *loadJsonFile;
  DBusKey *in_stack_fffffffffffffc60;
  DBusKey *in_stack_fffffffffffffc68;
  DBusKey *in_stack_fffffffffffffc70;
  QLatin1StringView in_stack_fffffffffffffc90;
  QString *fileName;
  QDBusListener *this_02;
  char local_2b8 [24];
  ChangeSignal local_2a0 [13];
  ChangeSignal local_238 [13];
  ChangeSignal local_1d0 [13];
  ChangeSignal local_168 [8];
  QString *in_stack_fffffffffffffed8;
  QDBusListener *in_stack_fffffffffffffee0;
  ChangeSignal local_100 [13];
  char local_98 [144];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
  ::clear((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
           *)in_stack_fffffffffffffc60);
  qEnvironmentVariable(local_98);
  bVar1 = QString::isEmpty((QString *)0xb22e3d);
  if (!bVar1) {
    loadJson(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  bVar1 = QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
          ::isEmpty((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
                     *)0xb22e61);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
    QString::QString(&in_stack_fffffffffffffc70->location,in_stack_fffffffffffffc90);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
    QString::QString(&in_stack_fffffffffffffc70->location,in_stack_fffffffffffffc90);
    DBusKey::DBusKey(in_stack_fffffffffffffc70,&in_stack_fffffffffffffc68->location,
                     &in_stack_fffffffffffffc60->location);
    ChangeSignal::ChangeSignal(local_100,Kde,ApplicationStyle);
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::insert((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
              *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
             (ChangeSignal *)in_stack_fffffffffffffc60);
    DBusKey::~DBusKey(in_stack_fffffffffffffc60);
    QString::~QString((QString *)0xb22f6a);
    QString::~QString((QString *)0xb22f77);
    this_00 = (DBusKey *)(in_RDI + 0x10);
    Qt::Literals::StringLiterals::operator____L1((char *)in_stack_fffffffffffffc68,(size_t)this_00);
    QString::QString(&in_stack_fffffffffffffc70->location,in_stack_fffffffffffffc90);
    Qt::Literals::StringLiterals::operator____L1((char *)in_stack_fffffffffffffc68,(size_t)this_00);
    QString::QString(&in_stack_fffffffffffffc70->location,in_stack_fffffffffffffc90);
    DBusKey::DBusKey(in_stack_fffffffffffffc70,&in_stack_fffffffffffffc68->location,
                     &this_00->location);
    ChangeSignal::ChangeSignal(local_168,Kde,Theme);
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::insert((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
              *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,(ChangeSignal *)this_00);
    DBusKey::~DBusKey(this_00);
    QString::~QString((QString *)0xb2306b);
    QString::~QString((QString *)0xb23078);
    key = (DBusKey *)(in_RDI + 0x10);
    QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
    this_02 = (QDBusListener *)QVar2.m_size;
    QString::QString(&in_stack_fffffffffffffc70->location,in_stack_fffffffffffffc90);
    QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
    fileName = (QString *)QVar2.m_data;
    QString::QString(&in_stack_fffffffffffffc70->location,in_stack_fffffffffffffc90);
    DBusKey::DBusKey(in_stack_fffffffffffffc70,&key->location,&this_00->location);
    ChangeSignal::ChangeSignal(local_1d0,Gtk,Theme);
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::insert((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
              *)in_stack_fffffffffffffc70,key,(ChangeSignal *)this_00);
    DBusKey::~DBusKey(this_00);
    QString::~QString((QString *)0xb23169);
    QString::~QString((QString *)0xb23176);
    this_01 = (DBusKey *)(in_RDI + 0x10);
    Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
    QString::QString(&this_01->location,in_stack_fffffffffffffc90);
    Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
    QString::QString(&this_01->location,in_stack_fffffffffffffc90);
    DBusKey::DBusKey(this_01,&key->location,&this_00->location);
    ChangeSignal::ChangeSignal(local_238,Gnome,ColorScheme);
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::insert((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
              *)this_01,key,(ChangeSignal *)this_00);
    DBusKey::~DBusKey(this_00);
    QString::~QString((QString *)0xb23255);
    QString::~QString((QString *)0xb23262);
    Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
    QString::QString(&this_01->location,in_stack_fffffffffffffc90);
    QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)key,(size_t)this_00);
    QString::QString(&this_01->location,QVar2);
    DBusKey::DBusKey(this_01,&key->location,&this_00->location);
    ChangeSignal::ChangeSignal(local_2a0,Gnome,Contrast);
    QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
    ::insert((QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
              *)this_01,key,(ChangeSignal *)this_00);
    DBusKey::~DBusKey(this_00);
    QString::~QString((QString *)0xb23344);
    QString::~QString((QString *)0xb23351);
    qEnvironmentVariable(local_2b8);
    bVar1 = QString::isEmpty((QString *)0xb2338b);
    if (!bVar1) {
      saveJson(this_02,fileName);
    }
    QString::~QString((QString *)0xb233ab);
  }
  QString::~QString((QString *)0xb233c3);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusListener::populateSignalMap()
{
    m_signalMap.clear();
    const QString &loadJsonFile = qEnvironmentVariable("QT_QPA_DBUS_SIGNALS");
    if (!loadJsonFile.isEmpty())
        loadJson(loadJsonFile);
    if (!m_signalMap.isEmpty())
        return;

    m_signalMap.insert(DBusKey("org.kde.kdeglobals.KDE"_L1, "widgetStyle"_L1),
                       ChangeSignal(Provider::Kde, Setting::ApplicationStyle));

    m_signalMap.insert(DBusKey("org.kde.kdeglobals.General"_L1, "ColorScheme"_L1),
                       ChangeSignal(Provider::Kde, Setting::Theme));

    m_signalMap.insert(DBusKey("org.gnome.desktop.interface"_L1, "gtk-theme"_L1),
                       ChangeSignal(Provider::Gtk, Setting::Theme));

    m_signalMap.insert(DBusKey("org.freedesktop.appearance"_L1, "color-scheme"_L1),
                       ChangeSignal(Provider::Gnome, Setting::ColorScheme));

    m_signalMap.insert(DBusKey("org.freedesktop.appearance"_L1, "contrast"_L1),
                       ChangeSignal(Provider::Gnome, Setting::Contrast));

    const QString &saveJsonFile = qEnvironmentVariable("QT_QPA_DBUS_SIGNALS_SAVE");
    if (!saveJsonFile.isEmpty())
        saveJson(saveJsonFile);
}